

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O3

int fl_stat(char *f,stat *b)

{
  int iVar1;
  
  iVar1 = stat64(f,(stat64 *)b);
  return iVar1;
}

Assistant:

int fl_stat(const char* f, struct stat *b) {

#if defined(WIN32) && !defined(__CYGWIN__) // Windows

  size_t l = strlen(f);
  unsigned wn = fl_utf8toUtf16(f, (unsigned) l, NULL, 0) + 1; // Query length
  wbuf = (xchar*)realloc(wbuf, sizeof(xchar)*wn);
  wn = fl_utf8toUtf16(f, (unsigned) l, (unsigned short *)wbuf, wn); // Convert string
  wbuf[wn] = 0;
  return _wstat(wbuf, (struct _stat*)b);

#else // other platforms

  return stat(f, b);

#endif

}